

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1274:16)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1274:16)>_>
          *this,FieldDescriptor *descriptor)

{
  FieldDescriptor *descriptor_local;
  VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1274:16)>_>
  *this_local;
  
  compiler::CommandLineInterface::Run::anon_class_16_2_e739539f::operator()
            ((anon_class_16_2_e739539f *)this,descriptor);
  return;
}

Assistant:

void Visit(const FieldDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
  }